

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O3

int pkey_bits_gost(EVP_PKEY *pk)

{
  int iVar1;
  int iVar2;
  
  iVar1 = -1;
  if (pk != (EVP_PKEY *)0x0) {
    iVar2 = EVP_PKEY_get_base_id();
    iVar1 = 0x100;
    if (iVar2 < 0x3d3) {
      if ((iVar2 != 0x32b) && (iVar2 != 0x331)) {
        return -1;
      }
    }
    else if (iVar2 != 0x3d3) {
      if (iVar2 != 0x3d4) {
        return -1;
      }
      return 0x200;
    }
  }
  return iVar1;
}

Assistant:

static int pkey_bits_gost(const EVP_PKEY *pk)
{
    if (!pk)
        return -1;

    switch (EVP_PKEY_base_id(pk)) {
    case NID_id_GostR3410_2001:
    case NID_id_GostR3410_2001DH:
    case NID_id_GostR3410_2012_256:
        return 256;
    case NID_id_GostR3410_2012_512:
        return 512;
    }

    return -1;
}